

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

SurfaceMesh * __thiscall polyscope::SurfaceMesh::setSmoothShade(SurfaceMesh *this,bool isSmooth)

{
  SurfaceMesh *pSVar1;
  
  pSVar1 = setShadeStyle(this,(uint)!isSmooth);
  return pSVar1;
}

Assistant:

SurfaceMesh* SurfaceMesh::setSmoothShade(bool isSmooth) {
  if (isSmooth) {
    return setShadeStyle(MeshShadeStyle::Smooth);
  } else {
    return setShadeStyle(MeshShadeStyle::Flat);
  }
}